

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void fmt::format<char,libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>>
               (BasicFormatter<char> *f,char **format_str,
               basic_string_view<char,_std::char_traits<char>_> *value)

{
  char *pcVar1;
  undefined **ppuVar2;
  basic_string_view<char,_std::char_traits<char>_> __sv;
  FormatBuf<char> format_buf;
  basic_ostream<char,_std::char_traits<char>_> output;
  MemoryBuffer<char,_500UL,_std::allocator<char>_> buffer;
  FormatBuf<char> FStack_3b8;
  anon_union_16_12_986ea841_for_Value_0 local_368;
  undefined4 local_358;
  libcxx_strviewclone local_340 [8];
  ios_base local_338 [264];
  MemoryBuffer<char,_500UL,_std::allocator<char>_> local_230;
  
  local_230.super_Buffer<char>.ptr_ = local_230.data_;
  local_230.super_Buffer<char>.size_ = 0;
  local_230.super_Buffer<char>.capacity_ = 500;
  ppuVar2 = &PTR_grow_00242788;
  local_230.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_00242788;
  internal::FormatBuf<char>::FormatBuf(&FStack_3b8,&local_230.super_Buffer<char>);
  std::ostream::ostream(local_340,(streambuf *)&FStack_3b8);
  __sv.__size = (size_type)ppuVar2;
  __sv.__data = (value_type *)value->__size;
  libcxx_strviewclone::operator<<
            (local_340,(basic_ostream<char,_std::char_traits<char>_> *)value->__data,__sv);
  local_368.custom.format = (FormatFunc)(FStack_3b8._40_8_ - (long)FStack_3b8.start_);
  local_368.pointer = local_230.super_Buffer<char>.ptr_;
  local_358 = 0xb;
  pcVar1 = BasicFormatter<char>::format(f,format_str,(Arg *)&local_368.string);
  *format_str = pcVar1;
  std::ios_base::~ios_base(local_338);
  std::streambuf::~streambuf((streambuf *)&FStack_3b8);
  internal::MemoryBuffer<char,_500UL,_std::allocator<char>_>::~MemoryBuffer(&local_230);
  return;
}

Assistant:

void format(BasicFormatter<Char> &f, const Char *&format_str, const T &value) {
  internal::MemoryBuffer<Char, internal::INLINE_BUFFER_SIZE> buffer;

  internal::FormatBuf<Char> format_buf(buffer);
  std::basic_ostream<Char> output(&format_buf);
  output << value;

  BasicStringRef<Char> str(&buffer[0], format_buf.size());
  internal::Arg arg = internal::MakeValue<Char>(str);
  arg.type = static_cast<internal::Arg::Type>(
        internal::MakeValue<Char>::type(str));
  format_str = f.format(format_str, arg);
}